

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

bool libtorrent::aux::anon_unknown_135::compare_disconnect_peer
               (peer_connection *lhs,peer_connection *rhs)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  time_point tVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  iVar4 = (*(lhs->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
  iVar5 = (*(rhs->super_bandwidth_socket)._vptr_bandwidth_socket[1])(rhs);
  if ((char)iVar4 != (char)iVar5) {
    iVar4 = (*(lhs->super_bandwidth_socket)._vptr_bandwidth_socket[1])(lhs);
    return SUB41(iVar4,0);
  }
  bVar2 = (bool)(((rhs->super_peer_connection_hot_members).field_0x28 & 0x10) >> 4);
  if ((bool)(((lhs->super_peer_connection_hot_members).field_0x28 & 0x10) >> 4) == bVar2) {
    bVar2 = peer_connection::is_seed(lhs);
    bVar3 = peer_connection::is_seed(rhs);
    if (bVar2 != bVar3) {
      bVar2 = peer_connection::is_seed(rhs);
      return bVar2;
    }
    bVar2 = peer_connection::on_parole(lhs);
    bVar3 = peer_connection::on_parole(rhs);
    if (bVar2 != bVar3) {
      bVar2 = peer_connection::on_parole(lhs);
      return bVar2;
    }
    iVar4 = (*(lhs->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])(lhs);
    lVar7 = *(long *)(CONCAT44(extraout_var,iVar4) + 0x20);
    iVar4 = (*(rhs->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])(rhs);
    lVar1 = *(long *)(CONCAT44(extraout_var_00,iVar4) + 0x20);
    tVar6 = time_now();
    lVar7 = lVar7 / (((long)tVar6.__d.__r - (lhs->m_connect).__d.__r) / 1000000000 + 1);
    lVar10 = ((long)tVar6.__d.__r - (rhs->m_connect).__d.__r) / 1000000000 + 1;
    lVar8 = lVar1 / lVar10;
    bVar2 = SBORROW8(lVar7,lVar8);
    lVar9 = lVar7 - lVar8;
    if (lVar7 == lVar8) {
      iVar4 = (*(lhs->super_bandwidth_socket)._vptr_bandwidth_socket[0xc])(lhs,lVar7,lVar1 % lVar10)
      ;
      iVar5 = (*(rhs->super_bandwidth_socket)._vptr_bandwidth_socket[0xc])(rhs);
      if ((char)iVar4 != (char)iVar5) {
        iVar4 = (*(lhs->super_bandwidth_socket)._vptr_bandwidth_socket[0xc])(lhs);
        return SUB41(iVar4,0);
      }
      lVar9 = (long)(lhs->m_last_receive).m_time_diff.__r * 1000000 + (lhs->m_connect).__d.__r;
      lVar7 = (long)(rhs->m_last_receive).m_time_diff.__r * 1000000 + (rhs->m_connect).__d.__r;
      bVar2 = SBORROW8(lVar9,lVar7);
      lVar9 = lVar9 - lVar7;
    }
    bVar2 = bVar2 != lVar9 < 0;
  }
  return bVar2;
}

Assistant:

bool compare_disconnect_peer(peer_connection const* lhs, peer_connection const* rhs)
	{
		// prefer to disconnect peers that are already disconnecting
		if (lhs->is_disconnecting() != rhs->is_disconnecting())
			return lhs->is_disconnecting();

		// prefer to disconnect peers we're not interested in
		if (lhs->is_interesting() != rhs->is_interesting())
			return rhs->is_interesting();

		// prefer to disconnect peers that are not seeds
		if (lhs->is_seed() != rhs->is_seed())
			return rhs->is_seed();

		// prefer to disconnect peers that are on parole
		if (lhs->on_parole() != rhs->on_parole())
			return lhs->on_parole();

		// prefer to disconnect peers that send data at a lower rate
		std::int64_t lhs_transferred = lhs->statistics().total_payload_download();
		std::int64_t rhs_transferred = rhs->statistics().total_payload_download();

		time_point const now = aux::time_now();
		std::int64_t const lhs_time_connected = total_seconds(now - lhs->connected_time());
		std::int64_t const rhs_time_connected = total_seconds(now - rhs->connected_time());

		lhs_transferred /= lhs_time_connected + 1;
		rhs_transferred /= (rhs_time_connected + 1);
		if (lhs_transferred != rhs_transferred)
			return lhs_transferred < rhs_transferred;

		// prefer to disconnect peers that chokes us
		if (lhs->is_choked() != rhs->is_choked())
			return lhs->is_choked();

		return lhs->last_received() < rhs->last_received();
	}